

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.cpp
# Opt level: O0

void __thiscall
llvm::SmallVectorBase::grow_pod(SmallVectorBase *this,void *FirstEl,size_t MinCapacity,size_t TSize)

{
  void *__src;
  size_t sVar1;
  unsigned_long *puVar2;
  void *local_40;
  void *NewElts;
  unsigned_long local_30;
  size_t NewCapacity;
  size_t TSize_local;
  size_t MinCapacity_local;
  void *FirstEl_local;
  SmallVectorBase *this_local;
  
  NewCapacity = TSize;
  TSize_local = MinCapacity;
  MinCapacity_local = (size_t)FirstEl;
  FirstEl_local = this;
  if (0xffffffff < MinCapacity) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  sVar1 = capacity(this);
  local_30 = sVar1 * 2 + 1;
  puVar2 = std::max<unsigned_long>(&local_30,&TSize_local);
  NewElts = (void *)0xffffffff;
  puVar2 = std::min<unsigned_long>(puVar2,(unsigned_long *)&NewElts);
  local_30 = *puVar2;
  if (this->BeginX == (void *)MinCapacity_local) {
    local_40 = safe_malloc(local_30 * NewCapacity);
    __src = this->BeginX;
    sVar1 = size(this);
    memcpy(local_40,__src,sVar1 * NewCapacity);
  }
  else {
    local_40 = safe_realloc(this->BeginX,local_30 * NewCapacity);
  }
  this->BeginX = local_40;
  this->Capacity = (uint)local_30;
  return;
}

Assistant:

void SmallVectorBase::grow_pod(void *FirstEl, size_t MinCapacity,
                               size_t TSize) {
  // Ensure we can fit the new capacity in 32 bits.
  if (MinCapacity > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  size_t NewCapacity = 2 * capacity() + 1; // Always grow.
  NewCapacity =
      std::min(std::max(NewCapacity, MinCapacity), size_t(UINT32_MAX));

  void *NewElts;
  if (BeginX == FirstEl) {
    NewElts = safe_malloc(NewCapacity * TSize);

    // Copy the elements over.  No need to run dtors on PODs.
    memcpy(NewElts, this->BeginX, size() * TSize);
  } else {
    // If this wasn't grown from the inline copy, grow the allocated space.
    NewElts = safe_realloc(this->BeginX, NewCapacity * TSize);
  }

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}